

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall
format::mtx_header_error::mtx_header_error(mtx_header_error *this,string *filename,string *msg)

{
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)filename);
  std::__cxx11::string::string((string *)&local_50,(string *)msg);
  mtx_error::mtx_error(&this->super_mtx_error,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_mtx_error = &PTR__mtx_error_0016c6d0;
  return;
}

Assistant:

mtx_header_error (
    std::string filename="Unknown",
    std::string msg="Invalid matrix header"
  )
  : mtx_error(filename, msg)
  {}